

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_extract2_i64_x86_64(TCGContext *tcg_ctx,TCGv_i64 ret,TCGv_i64 al,TCGv_i64 ah,uint ofs)

{
  uint ofs_local;
  TCGv_i64 ah_local;
  TCGv_i64 al_local;
  TCGv_i64 ret_local;
  TCGContext *tcg_ctx_local;
  
  if (ofs == 0) {
    tcg_gen_mov_i64_x86_64(tcg_ctx,ret,al);
  }
  else if (ofs == 0x40) {
    tcg_gen_mov_i64_x86_64(tcg_ctx,ret,ah);
  }
  else if (al == ah) {
    tcg_gen_rotri_i64_x86_64(tcg_ctx,ret,al,ofs);
  }
  else {
    tcg_gen_op4i_i64(tcg_ctx,INDEX_op_extract2_i64,ret,al,ah,(ulong)ofs);
  }
  return;
}

Assistant:

void tcg_gen_extract2_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 al, TCGv_i64 ah,
                          unsigned int ofs)
{
    tcg_debug_assert(ofs <= 64);
    if (ofs == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, al);
    } else if (ofs == 64) {
        tcg_gen_mov_i64(tcg_ctx, ret, ah);
    } else if (al == ah) {
        tcg_gen_rotri_i64(tcg_ctx, ret, al, ofs);
    } else {
#if TCG_TARGET_HAS_extract2_i64
        tcg_gen_op4i_i64(tcg_ctx, INDEX_op_extract2_i64, ret, al, ah, ofs);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shri_i64(tcg_ctx, t0, al, ofs);
        tcg_gen_deposit_i64(tcg_ctx, ret, t0, ah, 64 - ofs, ofs);
        tcg_temp_free_i64(tcg_ctx, t0);
#endif
    }
}